

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::BuildAuxNoReg(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  OpLayoutAuxNoReg *pOVar7;
  JITTimeFunctionBody *pJVar8;
  RegOpnd *src1Opnd;
  RegOpnd *pRVar9;
  AddrOpnd *src1Opnd_00;
  RegOpnd *pRVar10;
  Instr *pIVar11;
  HelperCallOpnd *this_00;
  Opnd *this_01;
  
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1425,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) goto LAB_004cdcf3;
    *puVar6 = 0;
  }
  pOVar7 = Js::ByteCodeReader::AuxNoReg(&this->m_jnReader);
  if (newOpcode == InitCachedFuncs) {
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar5 = JITTimeFunctionBody::GetLocalClosureReg(pJVar8);
    src1Opnd = BuildSrcOpnd(this,RVar5,TyVar);
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar5 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar8);
    pRVar9 = BuildSrcOpnd(this,RVar5,TyVar);
    src1Opnd_00 = BuildAuxArrayOpnd(this,AuxFuncInfoArray,pOVar7->Offset);
    pRVar10 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar11 = IR::Instr::New(ArgOut_A,&pRVar10->super_Opnd,&src1Opnd_00->super_Opnd,this->m_func);
    AddInstr(this,pIVar11,offset);
    pRVar10 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar11 = IR::Instr::New(ArgOut_A,&pRVar10->super_Opnd,&pRVar9->super_Opnd,pIVar11->m_dst,
                             this->m_func);
    AddInstr(this,pIVar11,0xffffffff);
    pRVar9 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar11 = IR::Instr::New(ArgOut_A,&pRVar9->super_Opnd,&src1Opnd->super_Opnd,pIVar11->m_dst,
                             this->m_func);
    AddInstr(this,pIVar11,0xffffffff);
    this_00 = IR::HelperCallOpnd::New(HelperOP_InitCachedFuncs,this->m_func);
    this_01 = pIVar11->m_dst;
    pIVar11 = IR::Instr::New(CallHelper,this->m_func);
    if (pIVar11->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004cdcf3;
      *puVar6 = 0;
    }
    pFVar1 = pIVar11->m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) goto LAB_004cdcf3;
      *puVar6 = 0;
    }
    bVar4 = (this_00->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
      bVar4 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar4 | 2;
    pIVar11->m_src1 = &this_00->super_Opnd;
    if (pIVar11->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004cdcf3;
      *puVar6 = 0;
    }
    pFVar1 = pIVar11->m_func;
    if (this_01->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) goto LAB_004cdcf3;
      *puVar6 = 0;
    }
    bVar4 = this_01->field_0xb;
    if ((bVar4 & 2) != 0) {
      this_01 = IR::Opnd::Copy(this_01,pFVar1);
      bVar4 = this_01->field_0xb;
    }
    this_01->field_0xb = bVar4 | 2;
    pIVar11->m_src2 = this_01;
    AddInstr(this,pIVar11,0xffffffff);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x144a,"((0))","Unknown AuxNoReg opcode");
  if (bVar3) {
    *puVar6 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_004cdcf3:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void
IRBuilder::BuildAuxNoReg(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr * instr;
    const unaligned Js::OpLayoutAuxNoReg *auxInsn = m_jnReader.AuxNoReg();

    switch (newOpcode)
    {
        case Js::OpCode::InitCachedFuncs:
        {
            IR::Opnd   *src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());
            IR::Opnd   *src2Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg());
            IR::Opnd   *src3Opnd = this->BuildAuxArrayOpnd(AuxArrayValue::AuxFuncInfoArray, auxInsn->Offset);

            instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src3Opnd, m_func);
            this->AddInstr(instr, offset);

            instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, instr->GetDst(), m_func);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            IR::HelperCallOpnd *helperOpnd;

            helperOpnd = IR::HelperCallOpnd::New(IR::HelperOP_InitCachedFuncs, this->m_func);
            src2Opnd = instr->GetDst();

            instr = IR::Instr::New(Js::OpCode::CallHelper, m_func);
            instr->SetSrc1(helperOpnd);
            instr->SetSrc2(src2Opnd);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            return;
        }

        default:
        {
            AssertMsg(UNREACHED, "Unknown AuxNoReg opcode");
            Fatal();
            break;
        }
    }
}